

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

ExecutionResult __thiscall nigel::Lexer::onExecute(Lexer *this,CodeBase *base)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  byte *pbVar6;
  pointer pLVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  Lexer *this_01;
  ulong uVar8;
  byte c;
  long lVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  ulong local_f8;
  int local_f0;
  String tmpStr;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  Lexer local_a8;
  __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  *local_48;
  Type local_40 [2];
  
  tmpStr._M_dataplus._M_p = (pointer)&tmpStr.field_2;
  tmpStr._M_string_length = 0;
  tmpStr.field_2._M_local_buf[0] = '\0';
  this->currLineNo = 1;
  this->currColumnNo = 0;
  pLVar7 = (base->fileCont).
           super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  if (pLVar7 != (base->fileCont).
                super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ::operator=(&(this->currLine).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ,(__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)pLVar7);
    this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->currPath;
    std::__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> *)this_00._M_pi,
               &(((base->fileCont).
                  super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
                  ._M_impl.super__Vector_impl_data._M_start)->path).
                super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>);
  }
  local_b8._8_8_ = &base->lexerStruct;
  local_48 = &(this->currLine).
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
  local_a8.currPath.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->currPath;
  uVar8 = 0;
  local_f8 = 0;
  bVar10 = false;
  bVar12 = false;
  bVar2 = false;
  bVar4 = false;
  local_f0 = 0;
  do {
    if (bVar10) {
      local_c8._0_4_ = 1;
      std::make_shared<nigel::Token,nigel::Token::Type>(local_40);
      makeToken(&local_a8,(shared_ptr<nigel::Token> *)this);
      std::__cxx11::
      list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>::
      push_back((list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
                 *)local_b8._8_8_,(value_type *)&local_a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_a8.super_BuilderExecutable.notificationList);
      this_01 = (Lexer *)&stack0xffffffffffffffc8;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_01);
      postLexer(this_01,base);
      if (base->printLexer == true) {
        printLexerStructure(this_01,base);
      }
      std::__cxx11::string::~string((string *)&tmpStr);
      return success;
    }
    lVar3 = uVar8 * 0x28;
    while( true ) {
      lVar9 = lVar3;
      pLVar7 = (base->fileCont).
               super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(base->fileCont).
                     super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar7) / 0x28;
      bVar10 = uVar5 <= uVar8;
      if (bVar10) break;
      this_00._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((long)&(pLVar7->content).
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr + lVar9);
      if ((_List_node_base *)this->currColumnNo <
          (((Lexer *)this_00._M_pi)->super_BuilderExecutable).notificationList.
          super__List_base<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
          ._M_impl._M_node.super__List_node_base._M_next) {
        this->currColumnNo = (size_t)((long)&((_List_node_base *)this->currColumnNo)->_M_next + 1);
        pbVar6 = (byte *)std::__cxx11::string::at((ulong)this_00._M_pi);
        c = *pbVar6;
        goto LAB_001730ae;
      }
      if (bVar2) {
        std::make_shared<nigel::Token_Comment,std::__cxx11::string&>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
        local_a8.currLine.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)local_c8._0_8_;
        local_a8.currLine.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_;
        local_c8._0_8_ = (pointer)0x0;
        local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        makeToken(&local_a8,(shared_ptr<nigel::Token> *)this);
        std::__cxx11::
        list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>::
        push_back((list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
                   *)local_b8._8_8_,(value_type *)&local_a8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_a8.super_BuilderExecutable.notificationList);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_a8.currLine.
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00._M_pi);
        tmpStr._M_string_length = 0;
        *tmpStr._M_dataplus._M_p = '\0';
        pLVar7 = (base->fileCont).
                 super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar5 = ((long)(base->fileCont).
                       super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar7) / 0x28;
        bVar2 = false;
      }
      this->currColumnNo = 0;
      uVar8 = uVar8 + 1;
      lVar3 = lVar9 + 0x28;
      if (uVar8 < uVar5) {
        this->currLineNo = *(size_t *)((long)&pLVar7[1].line + lVar9);
        std::
        __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ::operator=(local_48,(__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              *)((long)&pLVar7[1].content.
                                        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + lVar9));
        this_00._M_pi =
             local_a8.currPath.
             super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
        std::__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> *)
                   local_a8.currPath.
                   super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi,
                   (__shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&(base->fileCont).
                           super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].path.
                           super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + lVar9));
      }
    }
    c = 0;
LAB_001730ae:
    local_b8._M_allocated_capacity = (size_type)c;
    if ((!bVar12) || ((char)local_f8 != '\\' && c == 0x22)) {
      if (bVar2) {
        this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&tmpStr;
        std::__cxx11::string::push_back((char)this_00._M_pi);
      }
      else if (bVar4) {
        this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&tmpStr;
        std::__cxx11::string::push_back((char)this_00._M_pi);
        bVar4 = true;
        if ((c == 0x2f && (char)local_f8 == '*') && (local_f0 = local_f0 + -1, local_f0 == 0)) {
          std::__cxx11::string::pop_back();
          std::__cxx11::string::pop_back();
          std::make_shared<nigel::Token_Comment,std::__cxx11::string&>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
          local_a8.previousLineNo = local_c8._0_8_;
          local_a8.previousColumnNo = local_c8._8_8_;
          local_c8._0_8_ = (pointer)0x0;
          local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          makeToken(&local_a8,(shared_ptr<nigel::Token> *)this);
          std::__cxx11::
          list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>::
          push_back((list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
                     *)local_b8._8_8_,(value_type *)&local_a8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_a8.super_BuilderExecutable.notificationList);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8.previousColumnNo);
          this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00._M_pi);
          tmpStr._M_string_length = 0;
          *tmpStr._M_dataplus._M_p = '\0';
          bVar4 = false;
          local_f0 = 0;
        }
        local_f0 = local_f0 + (uint)(c == 0x2a && (char)local_f8 == '/');
      }
      else {
        if ((c < 0x21) && ((0x100002601U >> (local_b8._M_allocated_capacity & 0x3f) & 1) != 0)) {
          if (tmpStr._M_string_length != 0) {
            this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
            adoptToken(this,&tmpStr,base);
          }
          this->previousColumnNo = this->previousColumnNo + 1;
        }
        else {
          bVar4 = isOperator((Lexer *)this_00._M_pi,c);
          if (bVar4) {
            if (c == 0x2a) {
              this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&tmpStr;
              bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)this_00._M_pi,"/");
              if (bVar4) {
                tmpStr._M_string_length = 0;
                local_f0 = local_f0 + 1;
                *tmpStr._M_dataplus._M_p = '\0';
                bVar4 = true;
                goto switchD_001732db_caseD_6f;
              }
            }
            else if (local_b8._M_allocated_capacity._0_4_ == 0x2f) {
              this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&tmpStr;
              bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)this_00._M_pi,"/");
              if (bVar4) {
                tmpStr._M_string_length = 0;
                *tmpStr._M_dataplus._M_p = '\0';
                bVar2 = true;
                goto LAB_00173258;
              }
            }
            bVar4 = isOperator((Lexer *)this_00._M_pi,(char)local_f8);
            if (!bVar4) {
LAB_001734cb:
              if (tmpStr._M_string_length != 0) {
LAB_001734d3:
                adoptToken(this,&tmpStr,base);
              }
            }
          }
          else {
            if (9 < (byte)(c - 0x30)) {
              if (c == 0x78) {
                this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&tmpStr;
                bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)this_00._M_pi,"0");
                if (!bVar4) {
LAB_0017351d:
                  bVar4 = isDividingToken((Lexer *)this_00._M_pi,c);
                  if ((!bVar4) ||
                     (bVar4 = isDividingToken((Lexer *)this_00._M_pi,(char)local_f8), bVar4)) {
                    if (((char)local_f8 != '\0') &&
                       (bVar4 = isIdentifier((Lexer *)this_00._M_pi,(char)local_f8), !bVar4))
                    goto LAB_001734d3;
                    goto LAB_001734e3;
                  }
                  if (c != 0x22) goto LAB_001734cb;
                  if (bVar12) {
                    std::make_shared<nigel::Token_StringL,std::__cxx11::string&>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_c8);
                    local_a8.currLineNo = local_c8._0_8_;
                    local_a8.currColumnNo = local_c8._8_8_;
                    local_c8._0_8_ = (pointer)0x0;
                    local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    makeToken(&local_a8,(shared_ptr<nigel::Token> *)this);
                    std::__cxx11::
                    list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
                    ::push_back((list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
                                 *)local_b8._8_8_,(value_type *)&local_a8);
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                               &local_a8.super_BuilderExecutable.notificationList);
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8.currColumnNo)
                    ;
                    this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8);
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00._M_pi);
                    tmpStr._M_string_length = 0;
                    *tmpStr._M_dataplus._M_p = '\0';
                    bVar12 = false;
                  }
                  else {
                    bVar12 = tmpStr._M_string_length == 0;
                  }
                  goto LAB_00173258;
                }
              }
              else if ((((5 < (byte)((c & 0xdf) + 0xbf)) || (tmpStr._M_string_length < 2)) ||
                       (*tmpStr._M_dataplus._M_p != '0')) || (tmpStr._M_dataplus._M_p[1] != 'x'))
              goto LAB_0017351d;
            }
            if ((tmpStr._M_string_length != 0) &&
               ((9 < (byte)((char)local_f8 - 0x30U) &&
                (bVar4 = isIdentifier((Lexer *)this_00._M_pi,*tmpStr._M_dataplus._M_p), !bVar4)))) {
              std::__cxx11::string::substr((ulong)&local_a8,(ulong)&tmpStr);
              bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&local_a8,"0x");
              if (!bVar4) {
                bVar4 = std::operator==(&tmpStr,"-");
                if ((bVar4) || (bVar4 = std::operator==(&tmpStr,"+"), bVar4)) {
                  this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_a8;
                  if (*(long **)local_b8._8_8_ == (long *)local_b8._8_8_) goto LAB_0017354d;
                  iVar1 = *(int *)&(base->lexerStruct).
                                   super__List_base<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
                                   ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next[1].
                                   _M_prev;
                  std::__cxx11::string::~string((string *)this_00._M_pi);
                  if ((iVar1 == 0x18) || (iVar1 == 0x3b)) goto LAB_001734e3;
                }
                else {
                  this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_a8;
                  std::__cxx11::string::~string((string *)this_00._M_pi);
                }
                if (tmpStr._M_string_length != 0) goto LAB_001734d3;
                goto LAB_00173258;
              }
LAB_0017354d:
              std::__cxx11::string::~string((string *)&local_a8);
            }
          }
LAB_001734e3:
          this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&tmpStr;
          std::__cxx11::string::push_back((char)this_00._M_pi);
        }
LAB_00173258:
        bVar4 = false;
      }
      goto switchD_001732db_caseD_6f;
    }
    if ((char)local_f8 != '\\') {
      bVar12 = true;
      if (c == 0x5c) goto switchD_001732db_caseD_6f;
      goto LAB_0017326e;
    }
    uVar5 = (ulong)(c - 0x22);
    if ((c - 0x22 < 0x40) &&
       ((((0x400000020000021U >> (uVar5 & 0x3f) & 1) != 0 || (uVar5 == 0xe)) || (uVar5 == 0x3f))))
    goto LAB_0017326e;
    bVar12 = true;
    switch(c) {
    case 0x6e:
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x75:
      goto switchD_001732db_caseD_6f;
    case 0x72:
      break;
    case 0x74:
      break;
    case 0x76:
      break;
    default:
      if ((c == 0x62) || (bVar12 = true, c == 0x66)) break;
      goto switchD_001732db_caseD_6f;
    }
LAB_0017326e:
    this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&tmpStr;
    std::__cxx11::string::push_back((char)this_00._M_pi);
    bVar12 = true;
switchD_001732db_caseD_6f:
    bVar11 = (char)local_f8 == '\\';
    local_f8 = local_b8._M_allocated_capacity & 0xffffffff;
    if (bVar11) {
      local_f8 = 0;
    }
  } while( true );
}

Assistant:

ExecutionResult Lexer::onExecute( CodeBase &base )
	{
		size_t fileLine = 0;
		//size_t fileColumn = 0;

		u8 c, previousC = 0;
		String tmpStr;
		bool finish = false;
		currLineNo = 1;
		currColumnNo = 0;

		//Special values
		bool isString = false;//If is string literal
		bool isLineComment = false;//If is comment from // untile lineend
		bool isMultiComment = false;//If is multiline-comment with /* */
		int multiCommentCount = 0;//Enables nested comments
		if( !base.fileCont.empty() )
		{
			currLine = base.fileCont[0].content;
			currPath = base.fileCont[0].path;
		}

		while( !finish )
		{//Iterate whole file content
			while( fileLine < base.fileCont.size() && currColumnNo >= base.fileCont[fileLine].content->size() )
			{//Newline
				if( isLineComment )
				{
					base.lexerStruct.push_back( makeToken( std::make_shared<Token_Comment>( tmpStr ) ) );
					tmpStr.clear();
					isLineComment = false;
				}
				currColumnNo = 0;
				fileLine++;
				if( fileLine < base.fileCont.size() )
				{
					currLineNo = base.fileCont[fileLine].line;
					currLine = base.fileCont[fileLine].content;
					currPath = base.fileCont[fileLine].path;
				}
			}
			if( fileLine >= base.fileCont.size() )
			{
				finish = true;
				c = 0;
			}
			else c = base.fileCont[fileLine].content->at( currColumnNo++ );


			if( isString && ( c != '"' || previousC == '\\'  ) )
			{//Capture string literal
				if( previousC == '\\' )
				{
					if( c == '\\' ) tmpStr += '\\';//Backslash
					else if( c == 'n' ) tmpStr += '\n';//Newline
					else if( c == 'r' ) tmpStr += '\r';//Carriage return
					else if( c == 't' ) tmpStr += '\t';//Tabulator
					else if( c == 'v' ) tmpStr += '\v';//Vertical tabulator
					else if( c == 'b' ) tmpStr += '\b';//Backspace
					else if( c == 'f' ) tmpStr += '\f';//Form feed
					else if( c == 'a' ) tmpStr += '\a';//Alert
					else if( c == '?' ) tmpStr += '\?';//Question mark
					else if( c == '\'' ) tmpStr += '\'';//Single quote
					else if( c == '"' ) tmpStr += '\"';//Double quote
					else if( c == '0' ) tmpStr += '\0';//Null as value, not as character.
				}
				else if( c != '\\' ) tmpStr += c;
			}
			else if( isLineComment )
			{//Capture comment
				tmpStr += c;
			}
			else if( isMultiComment )
			{//Capture comment
				tmpStr += c;
				if( previousC == '*' && c == '/' )
				{//Comment finished
					multiCommentCount--;
					if( multiCommentCount == 0 )
					{
						tmpStr.pop_back();//Remove *
						tmpStr.pop_back();//Remove /

						base.lexerStruct.push_back( makeToken( std::make_shared<Token_Comment>( tmpStr ) ) );
						tmpStr.clear();
						isMultiComment = false;
					}
				}
				if( previousC == '/' && c == '*' ) multiCommentCount++;
			}


			else if( isWhitespace( c ) )
			{//Ignore and split token
				if( !tmpStr.empty() )
				{//Finish previous token
					adoptToken( tmpStr, base );
				}
				previousColumnNo++;
			}
			else if( isOperator( c ) )
			{
				if( c == '/' && tmpStr == "/" )
				{//Found comment with //
					isLineComment = true;
					tmpStr.clear();
				}
				else if( c == '*' && tmpStr == "/" )
				{//Found comment with /*
					isMultiComment = true;
					multiCommentCount++;
					tmpStr.clear();
				}

				else if( isOperator( previousC ) || tmpStr.empty() ) tmpStr += c;
				else if( !tmpStr.empty() )
				{//Finish previous token
					adoptToken( tmpStr, base );
					tmpStr += c;
				}
			}
			else if (isNumber(c) || (c == 'x' && tmpStr == "0") || ( isHexValue(c) && tmpStr.size() >=2 && tmpStr[0] == '0' && tmpStr[1] == 'x'))
			{
				if( tmpStr.empty() || isNumber( previousC ) || isIdentifier( tmpStr.front() ) || previousC == '0' || tmpStr.substr(0, 2) == "0x" ||
					( ( tmpStr == "-" || tmpStr == "+" ) && ( base.lexerStruct.empty() || base.lexerStruct.back()->type == Token::Type::operatorToken || base.lexerStruct.back()->type == Token::Type::dividingToken ) )
					) tmpStr += c;
				else if( !tmpStr.empty() )
				{//Finish previous token
					adoptToken( tmpStr, base );
					tmpStr += c;
				}
			}
			else if( isDividingToken( c ) && !isDividingToken( previousC ) )
			{
				if( c == '"' )
				{
					if( isString )
					{//Admit string
						base.lexerStruct.push_back( makeToken( std::make_shared<Token_StringL>( tmpStr ) ) );
						tmpStr.clear();
						isString = false;
					}
					else if( tmpStr.empty() ) isString = true;
				}
				else
				{
					if( isDividingToken( previousC ) || tmpStr.empty() ) tmpStr += c;
					else if( !tmpStr.empty() )
					{//Finish previous token
						adoptToken( tmpStr, base );
						tmpStr += c;
					}
				}
			}
			else
			{
				if( previousC == 0 || isIdentifier( previousC ) )
					tmpStr += c;
				else
				{//Finish previous token
					adoptToken( tmpStr, base );
					tmpStr += c;
				}
			}

			if( previousC != '\\' ) previousC = c;
			else previousC = 0;
		}
		base.lexerStruct.push_back( makeToken( std::make_shared<Token>( Token::Type::eof ) ) );

		postLexer( base );

		if( base.printLexer ) printLexerStructure( base );

		return ExecutionResult::success;
	}